

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpBroker.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall
helics::tcp::TcpBrokerSS::generateCLI(TcpBrokerSS *this)

{
  _func_int **pp_Var1;
  App *pAVar2;
  Option *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>::generateCLI
            (&this->
              super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>)
  ;
  pp_Var1 = (this->
            super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
            super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.
            super_Broker._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TCP Single Socket Broker arguments",&local_c2);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pp_Var1 + 5),
             &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar2 = (App *)(this->
                  super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>
                  ).super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.
                  super_Broker._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"--connections",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"target link connections",&local_c1);
  CLI::App::
  add_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0xfa8),&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  pAVar2 = (App *)(this->
                  super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>
                  ).super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.
                  super_Broker._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"--no_outgoing_connection",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"disable outgoing connections",&local_c1);
  this_00 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                      (pAVar2,&local_a0,(bool *)(in_RSI + 4000),&local_c0);
  CLI::Option::ignore_underscore<CLI::App>(this_00,true);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> TcpBrokerSS::generateCLI()
    {
        auto hApp = NetworkBroker::generateCLI();
        hApp->description("TCP Single Socket Broker arguments");
        hApp->add_option("--connections", connections, "target link connections");
        hApp->add_flag("--no_outgoing_connection",
                       no_outgoing_connections,
                       "disable outgoing connections")
            ->ignore_underscore();
        return hApp;
    }